

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O0

Int2_Man_t * Int2_ManStart(sat_solver2 *pSat,int *pGloVars,int nGloVars)

{
  int iVar1;
  Int2_Man_t *pIVar2;
  Vec_Int_t *pVVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  int local_2c;
  int i;
  Int2_Man_t *p;
  int nGloVars_local;
  int *pGloVars_local;
  sat_solver2 *pSat_local;
  
  pIVar2 = (Int2_Man_t *)calloc(1,0x20);
  pIVar2->pSat = pSat;
  pVVar3 = Vec_IntAllocArrayCopy(pGloVars,nGloVars);
  pIVar2->vGloVars = pVVar3;
  pVVar3 = Vec_IntInvert(pIVar2->vGloVars,-1);
  pIVar2->vVar2Glo = pVVar3;
  iVar1 = Vec_IntSize(pIVar2->vGloVars);
  pGVar4 = Gia_ManStart(iVar1 * 10);
  pIVar2->pGia = pGVar4;
  pcVar5 = Abc_UtilStrsav("interpolant");
  pIVar2->pGia->pName = pcVar5;
  for (local_2c = 0; local_2c < nGloVars; local_2c = local_2c + 1) {
    Gia_ManAppendCi(pIVar2->pGia);
  }
  Gia_ManHashStart(pIVar2->pGia);
  return pIVar2;
}

Assistant:

Int2_Man_t * Int2_ManStart( sat_solver2 * pSat, int * pGloVars, int nGloVars )
{
    Int2_Man_t * p;
    int i;
    p = ABC_CALLOC( Int2_Man_t, 1 );
    p->pSat     = pSat;
    p->vGloVars = Vec_IntAllocArrayCopy( pGloVars, nGloVars );
    p->vVar2Glo = Vec_IntInvert( p->vGloVars, -1 );
    p->pGia     = Gia_ManStart( 10 * Vec_IntSize(p->vGloVars) );
    p->pGia->pName = Abc_UtilStrsav( "interpolant" );
    for ( i = 0; i < nGloVars; i++ )
        Gia_ManAppendCi( p->pGia );
    Gia_ManHashStart( p->pGia );
    return p;
}